

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void prvTidyFreeAttrs(TidyDocImpl *doc,Node *node)

{
  AttVal *av_00;
  Bool BVar1;
  AttVal *av;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  while (node->attributes != (AttVal *)0x0) {
    av_00 = node->attributes;
    if (((av_00->attribute != (tmbstr)0x0) &&
        ((((av_00 != (AttVal *)0x0 && (av_00->dict != (Attribute *)0x0)) &&
          (av_00->dict->id == TidyAttr_ID)) ||
         (((av_00 != (AttVal *)0x0 && (av_00->dict != (Attribute *)0x0)) &&
          (av_00->dict->id == TidyAttr_NAME)))))) &&
       (BVar1 = prvTidyIsAnchorElement(doc,node), BVar1 != no)) {
      prvTidyRemoveAnchorByNode(doc,av_00->value,node);
    }
    node->attributes = av_00->next;
    prvTidyFreeAttribute(doc,av_00);
  }
  return;
}

Assistant:

void TY_(FreeAttrs)( TidyDocImpl* doc, Node *node )
{
    while ( node->attributes )
    {
        AttVal *av = node->attributes;

        if ( av->attribute )
        {
            if ( (attrIsID(av) || attrIsNAME(av)) &&
                 TY_(IsAnchorElement)(doc, node) )
            {
                TY_(RemoveAnchorByNode)( doc, av->value, node );
            }
        }

        node->attributes = av->next;
        TY_(FreeAttribute)( doc, av );
    }
}